

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h263d_api.c
# Opt level: O0

MPP_RET h263d_init(void *dec,ParserCfg *cfg)

{
  MppDecCfgSet *data;
  size_t stream_size;
  RK_U8 *stream;
  MPP_RET ret;
  H263dCtx *p;
  MppPacket task_pkt;
  H263dParser parser;
  ParserCfg *cfg_local;
  void *dec_local;
  
  task_pkt = (MppPacket)0x0;
  p = (H263dCtx *)0x0;
  parser = cfg;
  cfg_local = (ParserCfg *)dec;
  if (dec == (void *)0x0) {
    _mpp_log_l(2,"h263d_api","found NULL intput dec %p cfg %p\n","h263d_init",0,cfg);
    dec_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    data = (MppDecCfgSet *)mpp_osal_malloc("h263d_init",0x10000);
    if (data == (MppDecCfgSet *)0x0) {
      _mpp_log_l(2,"h263d_api","failed to malloc stream buffer size %d\n","h263d_init",0x10000);
      dec_local._4_4_ = MPP_ERR_MALLOC;
    }
    else {
      stream._4_4_ = mpp_packet_init(&p,data,0x10000);
      if (stream._4_4_ == MPP_OK) {
        mpp_packet_set_pos(p,data);
        mpp_packet_set_length(p,0);
        stream._4_4_ = mpp_h263_parser_init(&task_pkt,*(MppBufSlots *)((long)parser + 8));
        if (stream._4_4_ == MPP_OK) {
          *(undefined8 *)cfg_local = *(undefined8 *)((long)parser + 8);
          cfg_local->frame_slots = *(MppBufSlots *)((long)parser + 0x10);
          cfg_local->packet_slots = *(MppBufSlots *)((long)parser + 0x18);
          cfg_local->cfg = data;
          cfg_local->hw_info = (MppDecHwCap *)0x10000;
          *(H263dCtx **)(cfg_local + 1) = p;
          cfg_local[1].cfg = (MppDecCfgSet *)task_pkt;
          return MPP_OK;
        }
        _mpp_log_l(2,"h263d_api","failed to init parser\n","h263d_init");
      }
      else {
        _mpp_log_l(2,"h263d_api","failed to create mpp_packet for task\n","h263d_init");
      }
      if (p != (H263dCtx *)0x0) {
        mpp_packet_deinit(&p);
      }
      if (data != (MppDecCfgSet *)0x0) {
        mpp_osal_free("h263d_init",data);
      }
      dec_local._4_4_ = stream._4_4_;
    }
  }
  return dec_local._4_4_;
}

Assistant:

MPP_RET h263d_init(void *dec, ParserCfg *cfg)
{
    H263dParser parser = NULL;
    MppPacket task_pkt = NULL;
    H263dCtx *p;
    MPP_RET ret;
    RK_U8 *stream;
    size_t stream_size = h263d_INIT_STREAM_SIZE;

    if (NULL == dec) {
        mpp_err_f("found NULL intput dec %p cfg %p\n", dec, cfg);
        return MPP_ERR_NULL_PTR;
    }

    stream = mpp_malloc_size(RK_U8, stream_size);
    if (NULL == stream) {
        mpp_err_f("failed to malloc stream buffer size %d\n", stream_size);
        return MPP_ERR_MALLOC;
    }

    ret = mpp_packet_init(&task_pkt, stream, stream_size);
    if (ret) {
        mpp_err_f("failed to create mpp_packet for task\n");
        goto ERR_RET;
    }

    // reset task packet length to zero
    // NOTE: set length must after set pos
    mpp_packet_set_pos(task_pkt, stream);
    mpp_packet_set_length(task_pkt, 0);

    ret = mpp_h263_parser_init(&parser, cfg->frame_slots);
    if (ret) {
        mpp_err_f("failed to init parser\n");
        goto ERR_RET;
    }

    p = (H263dCtx *)dec;
    p->frame_slots  = cfg->frame_slots;
    p->packet_slots = cfg->packet_slots;
    p->cfg          = cfg->cfg;
    p->stream       = stream;
    p->stream_size  = stream_size;
    p->task_pkt     = task_pkt;
    p->parser       = parser;

    return MPP_OK;
ERR_RET:
    if (task_pkt) {
        mpp_packet_deinit(&task_pkt);
    }
    if (stream) {
        mpp_free(stream);
        stream = NULL;
    }
    return ret;
}